

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue promise_reaction_job(JSContext *ctx,int argc,JSValue *argv)

{
  JSValueUnion *pJVar1;
  JSRuntime *pJVar2;
  JSValue JVar3;
  int iVar4;
  ulong uVar5;
  int64_t iVar6;
  ulong uVar7;
  JSValue JVar8;
  JSValue JVar9;
  JSValue local_48;
  JSValue arg;
  
  iVar6 = argv[2].tag;
  JVar8 = argv[2];
  iVar4 = JS_ToBool(ctx,argv[3]);
  pJVar1 = &argv[4].u;
  arg.u = *pJVar1;
  arg.tag = argv[4].tag;
  JVar3 = *(JSValue *)pJVar1;
  JVar9 = *(JSValue *)pJVar1;
  if ((int)iVar6 == 3) {
    if (iVar4 == 0) {
      local_48 = *(JSValue *)pJVar1;
      if (0xfffffff4 < (uint)arg.tag) {
        *(int *)arg.u.ptr = *arg.u.ptr + 1;
        local_48 = JVar3;
      }
      goto LAB_0013c6cf;
    }
    if (0xfffffff4 < (uint)arg.tag) {
      *(int *)arg.u.ptr = *arg.u.ptr + 1;
    }
    JS_Throw(ctx,JVar9);
  }
  else {
    local_48 = JS_Call(ctx,JVar8,(JSValue)(ZEXT816(3) << 0x40),1,&arg);
LAB_0013c6cf:
    if ((int)local_48.tag != 6) {
      iVar4 = 0;
      goto LAB_0013c713;
    }
  }
  pJVar2 = ctx->rt;
  local_48 = pJVar2->current_exception;
  (pJVar2->current_exception).u.int32 = 0;
  (pJVar2->current_exception).tag = 2;
  iVar4 = 1;
LAB_0013c713:
  iVar6 = *(int64_t *)((long)&argv->tag + (ulong)(uint)(iVar4 << 4));
  if ((int)iVar6 == 3) {
    iVar6 = 3;
    uVar7 = 0;
    uVar5 = 0;
  }
  else {
    JVar8.tag = iVar6;
    JVar8.u.ptr = ((JSValueUnion *)((long)&argv->u + (ulong)(uint)(iVar4 << 4)))->ptr;
    JVar8 = JS_Call(ctx,JVar8,(JSValue)(ZEXT816(3) << 0x40),1,&local_48);
    iVar6 = JVar8.tag;
    uVar5 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
    uVar7 = (ulong)JVar8.u._0_4_;
  }
  JS_FreeValue(ctx,local_48);
  JVar9.tag = iVar6;
  JVar9.u.ptr = (void *)(uVar7 | uVar5);
  return JVar9;
}

Assistant:

static JSValue promise_reaction_job(JSContext *ctx, int argc,
                                    JSValueConst *argv)
{
    JSValueConst handler, arg, func;
    JSValue res, res2;
    BOOL is_reject;

    assert(argc == 5);
    handler = argv[2];
    is_reject = JS_ToBool(ctx, argv[3]);
    arg = argv[4];
#ifdef DUMP_PROMISE
    printf("promise_reaction_job: is_reject=%d\n", is_reject);
#endif

    if (JS_IsUndefined(handler)) {
        if (is_reject) {
            res = JS_Throw(ctx, JS_DupValue(ctx, arg));
        } else {
            res = JS_DupValue(ctx, arg);
        }
    } else {
        res = JS_Call(ctx, handler, JS_UNDEFINED, 1, &arg);
    }
    is_reject = JS_IsException(res);
    if (is_reject)
        res = JS_GetException(ctx);
    func = argv[is_reject];
    /* as an extension, we support undefined as value to avoid
       creating a dummy promise in the 'await' implementation of async
       functions */
    if (!JS_IsUndefined(func)) {
        res2 = JS_Call(ctx, func, JS_UNDEFINED,
                       1, (JSValueConst *)&res);
    } else {
        res2 = JS_UNDEFINED;
    }
    JS_FreeValue(ctx, res);

    return res2;
}